

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O1

REF_STATUS
ref_import_bin_ugrid_c2n(REF_CELL ref_cell,REF_INT ncell,FILE *file,REF_BOOL swap,REF_BOOL fat)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  REF_STATUS RVar4;
  REF_INT *chunk;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  undefined8 uVar8;
  uint uVar9;
  ulong uVar10;
  char *pcVar11;
  ulong uVar12;
  REF_INT *pRVar13;
  REF_INT new_cell;
  REF_INT nodes [27];
  int local_cc;
  long local_c8;
  FILE *local_c0;
  long local_b8;
  REF_CELL local_b0;
  REF_INT local_a8 [30];
  
  if (ncell < 1) {
    return 0;
  }
  uVar1 = ref_cell->node_per;
  if ((int)uVar1 < ref_cell->size_per) {
    local_a8[(int)uVar1] = -1;
  }
  uVar6 = 1000000;
  if (ncell < 1000000) {
    uVar6 = ncell;
  }
  if ((int)(uVar1 * uVar6) < 0) {
    pcVar11 = "malloc c2n of REF_INT negative";
    uVar8 = 499;
LAB_0015c49c:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",uVar8,
           "ref_import_bin_ugrid_c2n",pcVar11);
    RVar4 = 1;
  }
  else {
    chunk = (REF_INT *)malloc((ulong)(uVar1 * uVar6) << 2);
    if (chunk == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",499,
             "ref_import_bin_ugrid_c2n","malloc c2n of REF_INT NULL");
      RVar4 = 2;
    }
    else {
      local_b8 = (ulong)uVar1 * 4;
      iVar3 = 0;
      local_c8 = (long)(int)uVar1;
      local_c0 = file;
      local_b0 = ref_cell;
      do {
        uVar9 = ncell - iVar3;
        uVar7 = uVar9;
        if ((int)uVar6 < (int)uVar9) {
          uVar7 = uVar6;
        }
        uVar2 = ref_import_bin_ugrid_chunk(local_c0,swap,fat,uVar7 * (int)local_c8,chunk);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
                 0x1f8,"ref_import_bin_ugrid_c2n",(ulong)uVar2,"c2n");
          return uVar2;
        }
        if (0 < (int)uVar9) {
          uVar12 = 1;
          if (1 < (int)uVar7) {
            uVar12 = (ulong)uVar7;
          }
          uVar10 = 0;
          pRVar13 = chunk;
          do {
            if (0 < (int)local_c8) {
              uVar5 = 0;
              do {
                local_a8[uVar5] = pRVar13[uVar5] + -1;
                uVar5 = uVar5 + 1;
              } while (uVar1 != uVar5);
            }
            uVar9 = ref_cell_add(local_b0,local_a8,&local_cc);
            if (uVar9 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x1fd,"ref_import_bin_ugrid_c2n",(ulong)uVar9,"new cell");
              return uVar9;
            }
            if ((int)uVar10 + iVar3 != local_cc) {
              pcVar11 = "cell index";
              uVar8 = 0x1fe;
              goto LAB_0015c49c;
            }
            uVar10 = uVar10 + 1;
            pRVar13 = (REF_INT *)((long)pRVar13 + local_b8);
          } while (uVar10 != uVar12);
        }
        iVar3 = uVar7 + iVar3;
      } while (iVar3 < ncell);
      free(chunk);
      RVar4 = 0;
    }
  }
  return RVar4;
}

Assistant:

REF_FCN static REF_STATUS ref_import_bin_ugrid_c2n(REF_CELL ref_cell,
                                                   REF_INT ncell, FILE *file,
                                                   REF_BOOL swap,
                                                   REF_BOOL fat) {
  REF_INT node_per, max_chunk, nread, chunk, cell, node, new_cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT *c2n;

  if (0 < ncell) {
    /* to skip boundary tag */
    if (ref_cell_size_per(ref_cell) > ref_cell_node_per(ref_cell))
      nodes[ref_cell_node_per(ref_cell)] = REF_EMPTY;
    node_per = ref_cell_node_per(ref_cell);
    max_chunk = MIN(1000000, ncell);
    ref_malloc(c2n, node_per * max_chunk, REF_INT);
    nread = 0;
    while (nread < ncell) {
      chunk = MIN(max_chunk, ncell - nread);
      RSS(ref_import_bin_ugrid_chunk(file, swap, fat, node_per * chunk, c2n),
          "c2n");
      for (cell = 0; cell < chunk; cell++) {
        for (node = 0; node < node_per; node++) {
          nodes[node] = c2n[node + node_per * cell] - 1;
        }
        RSS(ref_cell_add(ref_cell, nodes, &new_cell), "new cell");
        RES(cell + nread, new_cell, "cell index");
      }
      nread += chunk;
    }
    ref_free(c2n);
  }

  return REF_SUCCESS;
}